

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

void __thiscall
cppcms::impl::details::basic_map<$7159f324$>::rehash(basic_map<_7159f324_> *this,size_t new_size)

{
  size_type sVar1;
  container *pcVar2;
  container *pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  ulong uVar7;
  undefined8 *puVar8;
  intrusive_list<_b487a5d2_> *piVar9;
  size_type sVar10;
  uint uVar11;
  container *p;
  basic_map<_7159f324_> local_68;
  value_type local_38;
  
  local_68.list_.end = (container *)0x0;
  local_68.size_ = 0;
  local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  local_68.list_.begin = (container *)0x0;
  local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_38.first = (container *)0x0;
  local_38.second = (container *)0x0;
  std::vector<$28565068$>::resize(&local_68.hash_,new_size,&local_38);
  p = (this->list_).begin;
  if (p != (container *)0x0) {
    do {
      intrusive_list<$b487a5d2$>::erase(&this->list_,p);
      sVar1 = (p->val).first._M_string_length;
      if (sVar1 == 0) {
        uVar7 = 0;
      }
      else {
        sVar10 = 0;
        uVar11 = 0;
        do {
          uVar11 = uVar11 * 0x10 + (uint)(byte)(p->val).first._M_dataplus._M_p[sVar10];
          uVar11 = uVar11 & 0xfffffff ^ uVar11 >> 0x18 & 0xfffffff0;
          sVar10 = sVar10 + 1;
        } while (sVar1 != sVar10);
        uVar7 = (ulong)uVar11;
      }
      uVar7 = (ulong)(uint)((int)(uVar7 % (ulong)((long)local_68.hash_.
                                                        super__Vector_base<_28565068_>._M_impl.
                                                        super__Vector_impl_data._M_finish -
                                                  (long)local_68.hash_.
                                                        super__Vector_base<_28565068_>._M_impl.
                                                        super__Vector_impl_data._M_start >> 4)) << 4
                           );
      puVar8 = (undefined8 *)
               ((long)&(local_68.hash_.super__Vector_base<_28565068_>._M_impl.
                        super__Vector_impl_data._M_start)->first + uVar7);
      if (*(long *)((long)&(local_68.hash_.super__Vector_base<_28565068_>._M_impl.
                            super__Vector_impl_data._M_start)->first + uVar7) == 0) {
        p->next = (container *)0x0;
        p->prev = local_68.list_.end;
        if (local_68.list_.end != (container *)0x0) {
          (local_68.list_.end)->next = p;
        }
        if (local_68.list_.begin == (container *)0x0) {
          local_68.list_.begin = p;
        }
        piVar9 = (intrusive_list<_b487a5d2_> *)(puVar8 + 1);
        local_68.list_.end = p;
LAB_00204ba1:
        piVar9->begin = p;
      }
      else {
        pcVar2 = (container *)puVar8[1];
        puVar8 = puVar8 + 1;
        pcVar3 = pcVar2->next;
        if (pcVar3 != (container *)0x0) {
          p->prev = pcVar2;
          p->next = pcVar3;
          piVar9 = (intrusive_list<_b487a5d2_> *)&pcVar2->next;
          if (pcVar2->next != (container *)0x0) {
            pcVar2->next->prev = p;
          }
          goto LAB_00204ba1;
        }
        p->next = (container *)0x0;
        p->prev = local_68.list_.end;
        if (local_68.list_.end != (container *)0x0) {
          (local_68.list_.end)->next = p;
        }
        piVar9 = &local_68.list_;
        local_68.list_.end = p;
        if (local_68.list_.begin == (container *)0x0) goto LAB_00204ba1;
      }
      *puVar8 = p;
      p = (this->list_).begin;
    } while (p != (container *)0x0);
    p = (container *)0x0;
  }
  pcVar2 = (this->list_).end;
  (this->list_).end = local_68.list_.end;
  ppVar4 = (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start =
       local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start;
  (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish =
       local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish;
  (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (this->list_).begin = local_68.list_.begin;
  local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  if (ppVar5 != ppVar4) {
    local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish = ppVar4
    ;
  }
  local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start = ppVar4;
  local_68.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       ppVar6;
  local_68.list_.begin = p;
  local_68.list_.end = pcVar2;
  ~basic_map(&local_68);
  return;
}

Assistant:

void rehash(size_t new_size)
	{
		basic_map tmp;
		tmp.hash_.resize(new_size,range_type(iterator(),iterator()));
		while(list_.begin) {
			iterator p=list_.begin;
			list_.erase(p);
			range_type &r = tmp.get(p->val.first);
			if(r.first == 0) {
				tmp.list_.push_back(p);
				r.first = r.second = p;
			}
			else {
				tmp.list_.insert_after(p,r.second);
				r.second = p;
			}
		}
		list_.swap(tmp.list_);
		hash_.swap(tmp.hash_);
		tmp.hash_.clear();
	}